

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O1

void __thiscall r_comp::Decompiler::write_view(Decompiler *this,uint16_t read_index,uint16_t arity)

{
  ulong in_RAX;
  long lVar1;
  ushort uVar2;
  char *pcVar3;
  ostringstream *poVar4;
  bool bVar5;
  bool after_tail_wildcard;
  undefined8 uStack_38;
  
  if ((ushort)(arity - 0xe) < 0xfff4) {
    poVar4 = this->out_stream->stream;
    pcVar3 = "nil";
    lVar1 = 3;
    uStack_38 = in_RAX;
  }
  else {
    uStack_38 = in_RAX & 0xffffffffffffff;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->out_stream->stream,"[",1);
    if (arity != 0) {
      uVar2 = 1;
      do {
        write_any(this,read_index + uVar2,(bool *)((long)&uStack_38 + 7),true,0);
        if (uVar2 < arity) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this->out_stream->stream," ",1);
        }
        bVar5 = uVar2 < arity;
        uVar2 = uVar2 + 1;
      } while (bVar5);
    }
    poVar4 = this->out_stream->stream;
    pcVar3 = "]";
    lVar1 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,pcVar3,lVar1);
  return;
}

Assistant:

void Decompiler::write_view(uint16_t read_index, uint16_t arity)
{
    if (arity > VIEW_CODE_MAX_SIZE || arity <= 1) {
        *out_stream << "nil";
        return;
    }

    bool after_tail_wildcard = false;
    *out_stream << "[";

    for (uint16_t j = 1; j <= arity; ++j) {
        write_any(read_index + j, after_tail_wildcard, true);

        if (j < arity) {
            *out_stream << " ";
        }
    }

    *out_stream << "]";
}